

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenGEXImporter.cpp
# Opt level: O2

void __thiscall
Assimp::OpenGEX::OpenGEXImporter::handleMetricNode
          (OpenGEXImporter *this,DDLNode *node,aiScene *param_2)

{
  ValueType VVar1;
  DDLNode *pDVar2;
  _Alloc_hider __rhs;
  bool bVar3;
  int32 iVar4;
  DDLNode *pDVar5;
  Property *pPVar6;
  Value *this_00;
  char *pcVar7;
  DeadlyImportError *this_01;
  size_t i;
  long lVar8;
  undefined1 *__lhs;
  float fVar9;
  allocator local_81;
  OpenGEXImporter *local_80;
  DDLNode *local_78;
  string local_70;
  string valName;
  
  if ((node != (DDLNode *)0x0) && (this->m_ctx != (Context *)0x0)) {
    pDVar2 = this->m_ctx->m_root;
    local_80 = this;
    local_78 = node;
    pDVar5 = ODDLParser::DDLNode::getParent(node);
    if (pDVar2 == pDVar5) {
      pPVar6 = ODDLParser::DDLNode::getProperties(local_78);
      local_80 = (OpenGEXImporter *)local_80->m_metrics;
      for (; pPVar6 != (Property *)0x0; pPVar6 = pPVar6->m_next) {
        if ((pPVar6->m_key != (Text *)0x0) && (pPVar6->m_value->m_type == ddl_string)) {
          std::__cxx11::string::string
                    ((string *)&valName,(char *)pPVar6->m_value->m_data,(allocator *)&local_70);
          __rhs = valName._M_dataplus;
          if (valName._M_dataplus._M_p == (pointer)0x0) {
            lVar8 = 0;
LAB_00443452:
            this_00 = ODDLParser::DDLNode::getValue(local_78);
            if (this_00 != (Value *)0x0) {
              VVar1 = this_00->m_type;
              if (VVar1 == ddl_int32) {
                iVar4 = ODDLParser::Value::getInt32(this_00);
                ((MetricInfo *)((long)local_80 + lVar8 * 0x28))->m_intValue = iVar4;
              }
              else if (VVar1 == ddl_string) {
                pcVar7 = ODDLParser::Value::getString(this_00);
                std::__cxx11::string::string((string *)&local_70,pcVar7,&local_81);
                std::__cxx11::string::operator=
                          ((string *)((long)local_80 + lVar8 * 0x28),(string *)&local_70);
                std::__cxx11::string::~string((string *)&local_70);
              }
              else {
                if (VVar1 != ddl_float) {
                  this_01 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
                  std::__cxx11::string::string
                            ((string *)&local_70,"OpenGEX: invalid data type for Metric node.",
                             &local_81);
                  DeadlyImportError::DeadlyImportError(this_01,&local_70);
                  __cxa_throw(this_01,&DeadlyImportError::typeinfo,
                              std::runtime_error::~runtime_error);
                }
                fVar9 = ODDLParser::Value::getFloat(this_00);
                ((MetricInfo *)((long)local_80 + lVar8 * 0x28))->m_floatValue = fVar9;
              }
            }
          }
          else {
            __lhs = Grammar::ValidMetricToken_abi_cxx11_;
            for (lVar8 = 0; lVar8 != 4; lVar8 = lVar8 + 1) {
              bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)__lhs,__rhs._M_p);
              if (bVar3) goto LAB_00443452;
              __lhs = (undefined1 *)((long)__lhs + 0x20);
            }
          }
          std::__cxx11::string::~string((string *)&valName);
        }
      }
    }
  }
  return;
}

Assistant:

void OpenGEXImporter::handleMetricNode( DDLNode *node, aiScene * /*pScene*/ ) {
    if( nullptr == node || nullptr == m_ctx ) {
        return;
    }

    if( m_ctx->m_root != node->getParent() ) {
        return;
    }

    Property *prop( node->getProperties() );
    while( nullptr != prop ) {
        if( nullptr != prop->m_key ) {
            if( Value::ddl_string == prop->m_value->m_type ) {
                std::string valName( ( char* ) prop->m_value->m_data );
                int type( Grammar::isValidMetricType( valName.c_str() ) );
                if( Grammar::NoneType != type ) {
                    Value *val( node->getValue() );
                    if( nullptr != val ) {
                        if( Value::ddl_float == val->m_type ) {
                            m_metrics[ type ].m_floatValue = val->getFloat();
                        } else if( Value::ddl_int32 == val->m_type ) {
                            m_metrics[ type ].m_intValue = val->getInt32();
                        } else if( Value::ddl_string == val->m_type ) {
                            m_metrics[type].m_stringValue = std::string( val->getString() );
                        } else {
                            throw DeadlyImportError( "OpenGEX: invalid data type for Metric node." );
                        }
                    }
                }
            }
        }
        prop = prop->m_next;
    }
}